

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_prepare_mlsag
              (uint8_t *m,uint8_t *sk,size_t nOuts,size_t nBlinded,size_t nCols,size_t nRows,
              uint8_t **pcm_in,uint8_t **pcm_out,uint8_t **blinds)

{
  uint8_t *puVar1;
  long lVar2;
  int iVar3;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  long lVar4;
  size_t sVar5;
  uint8_t **ppuVar6;
  size_t sVar7;
  bool bVar8;
  int overflow;
  long local_208;
  long local_200;
  size_t local_1f8;
  uint8_t *local_1f0;
  uint8_t **local_1e8;
  uint8_t *local_1e0;
  size_t local_1d8;
  size_t s;
  secp256k1_scalar ts;
  secp256k1_scalar accis;
  secp256k1_scalar accos;
  secp256k1_gej accj;
  secp256k1_ge cno;
  secp256k1_ge c;
  
  iVar3 = 1;
  if ((((nOuts != 0) && (nCols != 0)) && (m != (uint8_t *)0x0)) && (1 < nRows)) {
    local_1e8 = pcm_in;
    local_208 = nRows - 1;
    local_1f0 = m;
    local_1e0 = sk;
    local_1d8 = nBlinded;
    secp256k1_gej_set_infinity(&accj);
    sVar7 = extraout_RDX;
    for (sVar5 = 0; nOuts != sVar5; sVar5 = sVar5 + 1) {
      iVar3 = load_ge(&c,pcm_out[sVar5],sVar7);
      if (iVar3 == 0) {
        return 2;
      }
      secp256k1_gej_add_ge_var(&accj,&accj,&c,(secp256k1_fe *)0x0);
      sVar7 = extraout_RDX_00;
    }
    secp256k1_gej_neg(&accj,&accj);
    secp256k1_ge_set_gej(&cno,&accj);
    local_200 = local_208 * nCols;
    for (sVar7 = 0; puVar1 = local_1e0, sVar7 != nCols; sVar7 = sVar7 + 1) {
      local_1f8 = sVar7;
      secp256k1_gej_set_infinity(&accj);
      sVar7 = extraout_RDX_01;
      lVar4 = local_208;
      ppuVar6 = local_1e8;
      while (bVar8 = lVar4 != 0, lVar4 = lVar4 + -1, bVar8) {
        iVar3 = load_ge(&c,*ppuVar6,sVar7);
        if (iVar3 == 0) {
          return 3;
        }
        secp256k1_gej_add_ge_var(&accj,&accj,&c,(secp256k1_fe *)0x0);
        ppuVar6 = ppuVar6 + nCols;
        sVar7 = extraout_RDX_02;
      }
      secp256k1_gej_add_ge_var(&accj,&accj,&cno,(secp256k1_fe *)0x0);
      if (accj.infinity == 0) {
        secp256k1_ge_set_gej(&c,&accj);
        sVar7 = local_1f8;
        secp256k1_eckey_pubkey_serialize(&c,local_1f0 + (local_200 + local_1f8) * 0x21,&s,1);
      }
      else {
        lVar4 = (local_200 + local_1f8) * 0x21;
        puVar1 = local_1f0 + lVar4 + 0x10;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        puVar1[8] = '\0';
        puVar1[9] = '\0';
        puVar1[10] = '\0';
        puVar1[0xb] = '\0';
        puVar1[0xc] = '\0';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
        puVar1 = local_1f0 + lVar4;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        puVar1[8] = '\0';
        puVar1[9] = '\0';
        puVar1[10] = '\0';
        puVar1[0xb] = '\0';
        puVar1[0xc] = '\0';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
        local_1f0[lVar4 + 0x20] = '\0';
        sVar7 = local_1f8;
      }
      local_1e8 = local_1e8 + 1;
    }
    iVar3 = 0;
    if (blinds != (uint8_t **)0x0 && local_1e0 != (uchar *)0x0) {
      accis.d[2] = 0;
      accis.d[3] = 0;
      accis.d[0] = 0;
      accis.d[1] = 0;
      for (lVar4 = 0; lVar2 = local_208, local_208 != lVar4; lVar4 = lVar4 + 1) {
        secp256k1_scalar_set_b32(&ts,blinds[lVar4],&overflow);
        if (overflow != 0) {
          return 5;
        }
        secp256k1_scalar_add(&accis,&accis,&ts);
      }
      accos.d[2] = 0;
      accos.d[3] = 0;
      accos.d[0] = 0;
      accos.d[1] = 0;
      for (sVar7 = 0; local_1d8 != sVar7; sVar7 = sVar7 + 1) {
        secp256k1_scalar_set_b32(&ts,blinds[lVar2 + sVar7],&overflow);
        if (overflow != 0) {
          return 5;
        }
        secp256k1_scalar_add(&accos,&accos,&ts);
      }
      secp256k1_scalar_negate(&accos,&accos);
      secp256k1_scalar_add(&ts,&accis,&accos);
      secp256k1_scalar_get_b32(puVar1,&ts);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int secp256k1_prepare_mlsag(uint8_t *m, uint8_t *sk,
    size_t nOuts, size_t nBlinded, size_t nCols, size_t nRows,
    const uint8_t **pcm_in, const uint8_t **pcm_out, const uint8_t **blinds)
{
    /*
        Last matrix row is sum of input commitments - sum of output commitments

        Will return after summing commitments if sk or blinds is null

        m[col+(cols*row)]
        pcm_in[col+(cols*row)]
        pcm_out[nOuts]

        blinds[nBlinded]  array of pointers to 32byte blinding keys, inputs and outputs

        no. of inputs is nRows -1

        sum blinds up to nBlinded, pass fee commitment in pcm_out after nBlinded

    */

    secp256k1_gej accj;
    secp256k1_ge c, cno;
    size_t nIns = nRows -1;
    size_t s, i, k;
    int overflow;
    secp256k1_scalar accos, accis, ts;

    if (!m
        || nRows < 2
        || nCols < 1
        || nOuts < 1) {
        return 1;
    }

    /* sum output commitments */
    secp256k1_gej_set_infinity(&accj);
    for (k = 0; k < nOuts; ++k) {
        if (!load_ge(&c, pcm_out[k], 33)) {
            return 2;
        }
        secp256k1_gej_add_ge_var(&accj, &accj, &c, NULL);
    }

    secp256k1_gej_neg(&accj, &accj);
    secp256k1_ge_set_gej(&cno, &accj);

    for (k = 0; k < nCols; ++k) {
        /* sum column input commitments */
        secp256k1_gej_set_infinity(&accj);
        for (i = 0; i < nIns; ++i) {
            if (!load_ge(&c, pcm_in[k+nCols*i], 33)) {
                return 3;
            }
            secp256k1_gej_add_ge_var(&accj, &accj, &c, NULL);
        }

        /* subtract output commitments */
        secp256k1_gej_add_ge_var(&accj, &accj, &cno, NULL);

        /* store in last row, nRows -1 */
        if (secp256k1_gej_is_infinity(&accj)) {
            /* With no blinds set, sum input commitments == sum output commitments */
            memset(&m[(k+nCols*nIns)*33], 0, 33); /* consistent infinity point */
            continue;
        }
        secp256k1_ge_set_gej(&c, &accj);
        secp256k1_eckey_pubkey_serialize(&c, &m[(k+nCols*nIns)*33], &s, 1);
        /* pedersen_commitment_save(&m[(k+nCols*nIns)*33], &c); */
    }

    if (!sk || !blinds) {
        return 0;
    }

    /* sum input blinds */
    secp256k1_scalar_clear(&accis);
    for (k = 0; k < nIns; ++k) {
        secp256k1_scalar_set_b32(&ts, blinds[k], &overflow);
        if (overflow) {
            return 5;
        }
        secp256k1_scalar_add(&accis, &accis, &ts);
    }

    /* sum output blinds */
    secp256k1_scalar_clear(&accos);
    for (k = 0; k < nBlinded; ++k) {
        secp256k1_scalar_set_b32(&ts, blinds[nIns+k], &overflow);
        if (overflow) {
            return 5;
        }
        secp256k1_scalar_add(&accos, &accos, &ts);
    }

    secp256k1_scalar_negate(&accos, &accos);

    /* subtract output blinds */
    secp256k1_scalar_add(&ts, &accis, &accos);

    secp256k1_scalar_get_b32(sk, &ts);

    return 0;
}